

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O0

void __thiscall EventLoop::loop(EventLoop *this)

{
  bool bVar1;
  log_level lVar2;
  element_type *this_00;
  Logger *pLVar3;
  longlong lVar4;
  int __timeout;
  ulong in_RCX;
  nfds_t __nfds;
  char *in_RSI;
  id local_20;
  int local_14;
  EventLoop *pEStack_10;
  int cnt;
  EventLoop *this_local;
  
  this->el_quit = false;
  pEStack_10 = this;
  while (__timeout = (int)in_RCX, ((this->el_quit ^ 0xffU) & 1) != 0) {
    this_00 = std::__shared_ptr_access<Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Epoll,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         this);
    local_14 = Epoll::poll(this_00,(pollfd *)in_RSI,__nfds,__timeout);
    pLVar3 = Logger::get_instance();
    bVar1 = Logger::is_inited(pLVar3);
    if ((!bVar1) && (-1 < pr_level)) {
      in_RSI = "error";
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","loop",0x3e);
    }
    lVar2 = Logger::get_log_level();
    in_RCX = (ulong)lVar2;
    if (1 < (int)lVar2) {
      pLVar3 = Logger::get_instance();
      local_20 = std::this_thread::get_id();
      lVar4 = tid_to_ll(&local_20);
      in_RSI = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp"
      ;
      in_RCX = 0x3e;
      Logger::write_log(pLVar3,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/event_loop.cpp"
                        ,"loop",0x3e,LOG_LEVEL_INFO,
                        "eventloop, tid %lld, loop once, epoll event cnt %d\n",lVar4,local_14);
      pLVar3 = Logger::get_instance();
      Logger::flush(pLVar3);
    }
    execute_task_funcs(this);
  }
  return;
}

Assistant:

void EventLoop::loop() {
    el_quit = false;
    while (!el_quit) {
        auto cnt = el_epoller->poll();
LOG_INFO("eventloop, tid %lld, loop once, epoll event cnt %d\n", tid_to_ll(this_thread::get_id()), cnt);
        execute_task_funcs();
    }
}